

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argtable3.c
# Opt level: O2

void arg_cat_optionv(char *dest,size_t ndest,char *shortopts,char *longopts,char *datatype,
                    int optvalue,char *separator)

{
  char *pcVar1;
  size_t sVar2;
  size_t __n;
  undefined4 in_register_0000008c;
  char *pcVar3;
  char local_5b;
  char local_5a;
  undefined1 local_59;
  size_t local_58;
  char *local_50;
  char *local_48;
  char *local_40;
  int local_34;
  
  local_34 = (int)datatype;
  local_58 = 200;
  local_40 = "";
  if (CONCAT44(in_register_0000008c,optvalue) != 0) {
    local_40 = (char *)CONCAT44(in_register_0000008c,optvalue);
  }
  local_50 = dest;
  if (ndest == 0) {
    if (shortopts == (char *)0x0) {
      if (longopts == (char *)0x0) {
        return;
      }
      goto LAB_001070eb;
    }
LAB_00107050:
    local_48 = longopts;
    while (*shortopts != '\0') {
      arg_cat(&local_50,"--",&local_58);
      sVar2 = strcspn(shortopts,",");
      __n = local_58;
      if (sVar2 < local_58) {
        __n = sVar2;
      }
      strncat(local_50,shortopts,__n);
      pcVar3 = shortopts + sVar2;
      pcVar1 = shortopts + sVar2;
      shortopts = pcVar3;
      if (*pcVar1 == ',') {
        arg_cat(&local_50,local_40,&local_58);
        shortopts = pcVar3 + 1;
      }
    }
    if (local_48 == (char *)0x0) {
      return;
    }
    pcVar3 = "=";
    longopts = local_48;
  }
  else {
    local_48 = (char *)ndest;
    for (pcVar3 = (char *)(ndest + 1); pcVar3[-1] != '\0'; pcVar3 = pcVar3 + 1) {
      local_5b = '-';
      local_59 = 0;
      local_5a = pcVar3[-1];
      arg_cat(&local_50,&local_5b,&local_58);
      if (*pcVar3 != '\0') {
        arg_cat(&local_50,local_40,&local_58);
      }
    }
    if (shortopts != (char *)0x0) {
      arg_cat(&local_50,local_40,&local_58);
      goto LAB_00107050;
    }
    if (longopts == (char *)0x0) {
      return;
    }
    if (local_48 == (char *)0x0) goto LAB_001070eb;
    pcVar3 = " ";
  }
  arg_cat(&local_50,pcVar3,&local_58);
LAB_001070eb:
  if (local_34 != 0) {
    arg_cat(&local_50,"[",&local_58);
    arg_cat(&local_50,longopts,&local_58);
    longopts = "]";
  }
  arg_cat(&local_50,longopts,&local_58);
  return;
}

Assistant:

static
void arg_cat_optionv(char * dest,
					 size_t ndest,
					 const char * shortopts,
					 const char * longopts,
					 const char * datatype,
					 int optvalue,
					 const char * separator) {
	separator = separator ? separator : "";

	if (shortopts) {
		const char * c = shortopts;

		while (*c) {
			/* "-a|-b|-c" */
			char shortopt[3];

			/* note: shortopt array[] is initialiazed dynamically here to satisfy */
			/* a deficiency in the watcom compiler wrt static array initializers. */
			shortopt[0] = '-';
			shortopt[1] = *c;
			shortopt[2] = 0;

			arg_cat(&dest, shortopt, &ndest);

			if (*++c) {
				arg_cat(&dest, separator, &ndest);
			}
		}
	}

	/* put separator between long opts and short opts */
	if (shortopts && longopts) {
		arg_cat(&dest, separator, &ndest);
	}

	if (longopts) {
		const char * c = longopts;

		while (*c) {
			size_t ncspn;

			/* add "--" tag prefix */
			arg_cat(&dest, "--", &ndest);

			/* add comma separated option tag */
			ncspn = strcspn(c, ",");
			strncat(dest, c, (ncspn < ndest) ? ncspn : ndest);
			c += ncspn;

			/* add given separator in place of comma */
			if (*c == ',') {
				arg_cat(&dest, separator, &ndest);
				c++;
			}
		}
	}

	if (datatype) {
		if (longopts) {
			arg_cat(&dest, "=", &ndest);
		} else if (shortopts) {
			arg_cat(&dest, " ", &ndest);
		}

		if (optvalue) {
			arg_cat(&dest, "[", &ndest);
			arg_cat(&dest, datatype, &ndest);
			arg_cat(&dest, "]", &ndest);
		} else {
			arg_cat(&dest, datatype, &ndest);
		}
	}
}